

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.cpp
# Opt level: O2

LPCUTF8 utf8::PrevCharFull(LPCUTF8 ptr,LPCUTF8 start)

{
  LPCUTF8 puVar1;
  LPCUTF8 puVar2;
  
  puVar2 = ptr;
  if (start < ptr) {
    puVar2 = ptr + -1;
    if (start < puVar2) {
      start = puVar2;
    }
    puVar1 = NextChar(start);
    if (puVar1 == ptr) {
      puVar2 = start;
    }
  }
  return puVar2;
}

Assistant:

LPCUTF8 PrevCharFull(LPCUTF8 ptr, LPCUTF8 start)
    {
        if (ptr > start)
        {
            LPCUTF8 current = ptr - 1;
            while (current > start && (*current & 0xC0) == 0x80)
                current--;
            if (NextChar(current) == ptr)
                return current;

            // It is not a valid encoding, just go back one character.
            return ptr - 1;
        }
        else
            return ptr;
    }